

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<int,_ft::allocator<int>_>::list
          (list<int,_ft::allocator<int>_> *this,list<int,_ft::allocator<int>_> *other)

{
  constListIterator<int> local_38;
  constListIterator<int> local_28;
  
  this->m_head = (node *)0x0;
  this->m_tail = (node *)0x0;
  this->m_size = 0;
  listInit(this);
  local_38.super_listIterator<int>.m_node = other->m_head->next;
  local_38.super_listIterator<int>._vptr_listIterator = (_func_int **)&PTR__listIterator_0010dd00;
  local_28.super_listIterator<int>.m_node = other->m_tail;
  local_28.super_listIterator<int>._vptr_listIterator = (_func_int **)&PTR__listIterator_0010dd00;
  list<int,ft::allocator<int>>::assign<ft::constListIterator<int>>
            ((list<int,ft::allocator<int>> *)this,&local_38,&local_28,(type *)0x0);
  return;
}

Assistant:

list(list const & other):
		m_head(NULL),
		m_tail(NULL),
		m_size(0),
		m_alloc(other.get_allocator()) {
		this->listInit();
		this->assign(other.begin(), other.end());
	}